

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O0

Byte * z7_BranchConv_ARMT_Enc(Byte *data,SizeT size,UInt32 pc)

{
  byte *pbVar1;
  ushort *puVar2;
  ushort *puVar3;
  UInt32 pc_local;
  SizeT size_local;
  Byte *data_local;
  UInt32 c;
  UInt32 v;
  uint b3;
  uint b1;
  Byte *lim;
  ushort *local_18;
  ushort *local_10;
  
  local_10 = (ushort *)data;
  if (2 < (size & 0xfffffffffffffffe)) {
    puVar2 = (ushort *)(data + ((size & 0xfffffffffffffffe) - 2));
    local_18 = (ushort *)data;
    do {
      v = (UInt32)*(byte *)((long)local_18 + 1);
      do {
        if (puVar2 <= local_18) {
          return (Byte *)local_18;
        }
        pbVar1 = (byte *)((long)local_18 + 3);
        puVar3 = local_18 + 1;
        if (0xf7 < ((uint)*pbVar1 & (v ^ 8))) break;
        if (puVar2 <= puVar3) {
          return (Byte *)puVar3;
        }
        v = (UInt32)*(byte *)((long)local_18 + 5);
        local_18 = local_18 + 2;
        puVar3 = local_18;
      } while ((v & (*pbVar1 ^ 8)) < 0xf8);
      local_18 = puVar3;
      local_10 = local_18 + 1;
      data_local._4_4_ =
           ((pc - (int)data) + (int)local_10 >> 1) + ((uint)local_18[-1] << 0xb | *local_18 & 0x7ff)
      ;
      local_18[-1] = (ushort)(data_local._4_4_ >> 0xb) & 0x7ff | 0xf000;
      *local_18 = (ushort)data_local._4_4_ | 0xf800;
      local_18 = local_10;
    } while (local_10 < puVar2);
  }
  return (Byte *)local_10;
}

Assistant:

Z7_BRANCH_FUNCS_IMP(BranchConv_ARMT)


// #define BR_IA64_NO_INLINE

Z7_BRANCH_FUNC_MAIN(BranchConv_IA64)
{
  // Byte *p = data;
  const Byte *lim;
  size &= ~(SizeT)15;
  lim = p + size;
  pc -= 1 << 4;
  pc >>= 4 - 1;
  // pc -= 1 << 1;
  
  for (;;)
  {
    unsigned m;
    for (;;)
    {
      if Z7_UNLIKELY(p == lim)
        return p;
      m = (unsigned)((UInt32)0x334b0000 >> (*p & 0x1e));
      p += 16;
      pc += 1 << 1;
      if (m &= 3)
        break;
    }
    {
      p += (ptrdiff_t)m * 5 - 20; // negative value is expected here.
      do
      {
        const UInt32 t =
          #if defined(MY_CPU_X86_OR_AMD64)
            // we use 32-bit load here to reduce code size on x86:
            GetUi32(p);
          #else
            GetUi16(p);
          #endif
        UInt32 z = GetUi32(p + 1) >> m;
        p += 5;
        if (((t >> m) & (0x70 << 1)) == 0
            && ((z - (0x5000000 << 1)) & (0xf000000 << 1)) == 0)
        {
          UInt32 v = (UInt32)((0x8fffff << 1) | 1) & z;
          z ^= v;
        #ifdef BR_IA64_NO_INLINE
          v |= (v & ((UInt32)1 << (23 + 1))) >> 3;
          {
            UInt32 c = pc;
            BR_CONVERT_VAL(v, c)
          }
          v &= (0x1fffff << 1) | 1;
        #else
          {
            if (encoding)
            {
              // pc &= ~(0xc00000 << 1); // we just need to clear at least 2 bits
              pc &= (0x1fffff << 1) | 1;
              v += pc;
            }
            else
            {
              // pc |= 0xc00000 << 1; // we need to set at least 2 bits
              pc |= ~(UInt32)((0x1fffff << 1) | 1);
              v -= pc;
            }
          }
          v &= ~(UInt32)(0x600000 << 1);
        #endif
          v += (0x700000 << 1);
          v &= (0x8fffff << 1) | 1;
          z |= v;
          z <<= m;
          SetUi32(p + 1 - 5, z)
        }
        m++;
      }
      while (m &= 3); // while (m < 4);
    }
  }
}